

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution.hpp
# Opt level: O1

void __thiscall diy::Master::ProcessBlock::operator()(ProcessBlock *this)

{
  deque<int,_std::allocator<int>_> *pdVar1;
  _Map_pointer ppiVar2;
  _Map_pointer ppiVar3;
  _Elt_pointer piVar4;
  Master *pMVar5;
  pointer puVar6;
  _Head_base<0UL,_diy::Master::BaseCommand_*,_false> _Var7;
  void *pvVar8;
  Link *pLVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  mapped_type *this_00;
  ulong uVar13;
  size_t *psVar14;
  pointer puVar15;
  long lVar16;
  ProcessBlock *pPVar17;
  ulong uVar18;
  uint *puVar19;
  void *pvVar20;
  pointer puVar21;
  int i;
  vector<int,_std::allocator<int>_> local;
  int gid;
  uint local_1a4;
  ProcessBlock *local_1a0;
  vector<int,_std::allocator<int>_> local_198;
  int local_17c;
  pointer local_178;
  mapped_type *local_170;
  critical_resource<int,_tthread::fast_mutex> *local_168;
  undefined1 auStack_160 [9];
  uint7 uStack_157;
  _Rb_tree_node_base local_148;
  size_t local_128 [2];
  _Rb_tree_node_base local_118;
  size_t local_f8;
  CollectivesList *local_f0;
  cothread_t pvStack_e8;
  bool local_e0;
  void *local_d8;
  Link *local_d0;
  critical_resource<int,_tthread::fast_mutex> *local_c0;
  Master *pMStack_b8;
  IExchangeInfo *local_b0;
  _Rb_tree_node_base local_a0;
  size_t local_80 [2];
  _Rb_tree_node_base local_70;
  size_t local_50;
  CollectivesList *local_48;
  cothread_t pvStack_40;
  bool local_38;
  
  local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_1a0 = this;
  while( true ) {
    pPVar17 = local_1a0;
    local_168 = local_1a0->idx;
    auStack_160._0_8_ = &local_168->m_;
    stack0xfffffffffffffea8 = (IExchangeInfo *)((ulong)stack0xfffffffffffffea8 & 0xffffffffffffff00)
    ;
    std::unique_lock<tthread::fast_mutex>::lock((unique_lock<tthread::fast_mutex> *)auStack_160);
    stack0xfffffffffffffea8 = (IExchangeInfo *)CONCAT71(uStack_157,1);
    uVar13 = (ulong)local_168->x_;
    local_168->x_ = local_168->x_ + 1;
    if ((Master *)auStack_160._0_8_ != (Master *)0x0) {
      LOCK();
      *(int *)&(((vector<diy::Link_*,_std::allocator<diy::Link_*>_> *)auStack_160._0_8_)->
               super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>)._M_impl.
               super__Vector_impl_data._M_start = 0;
      UNLOCK();
      stack0xfffffffffffffea8 = (IExchangeInfo *)((ulong)uStack_157 << 8);
    }
    pdVar1 = pPVar17->blocks;
    ppiVar2 = (pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
              _M_finish._M_node;
    ppiVar3 = (pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
              _M_start._M_node;
    piVar4 = (pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data.
             _M_start._M_cur;
    if (((long)(pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data
               ._M_start._M_last - (long)piVar4 >> 2) +
        ((long)(pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data
               ._M_finish._M_cur -
         (long)(pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.super__Deque_impl_data
               ._M_finish._M_first >> 2) +
        ((((ulong)((long)ppiVar2 - (long)ppiVar3) >> 3) - 1) + (ulong)(ppiVar2 == (_Map_pointer)0x0)
        ) * 0x80 <= uVar13) break;
    uVar18 = ((long)piVar4 -
              (long)(pdVar1->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                    super__Deque_impl_data._M_start._M_first >> 2) + uVar13;
    if (uVar18 < 0x80) {
      puVar19 = (uint *)(piVar4 + uVar13);
    }
    else {
      uVar13 = (uVar18 >> 7) + 0xfe00000000000000;
      if (0 < (long)uVar18) {
        uVar13 = uVar18 >> 7;
      }
      puVar19 = (uint *)(ppiVar3[uVar13] + uVar18 + uVar13 * -0x80);
    }
    local_1a4 = *puVar19;
    pMVar5 = pPVar17->master;
    local_17c = (pMVar5->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)local_1a4];
    if ((pMVar5->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[(int)local_1a4] != (void *)0x0) {
      if ((long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == (long)pPVar17->local_limit) {
        unload(pMVar5,&local_198);
      }
      if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_198,
                   (iterator)
                   local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_1a4);
      }
      else {
        *local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_1a4;
        local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    uVar11 = local_1a4;
    puVar21 = (pPVar17->master->commands_).
              super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (pPVar17->master->commands_).
             super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar21 == puVar6) {
      bVar10 = true;
    }
    else {
      bVar10 = true;
      do {
        puVar15 = puVar21 + 1;
        _Var7._M_head_impl =
             (puVar21->_M_t).
             super___uniq_ptr_impl<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>
             ._M_t.
             super__Tuple_impl<0UL,_diy::Master::BaseCommand_*,_std::default_delete<diy::Master::BaseCommand>_>
             .super__Head_base<0UL,_diy::Master::BaseCommand_*,_false>._M_head_impl;
        iVar12 = (*(_Var7._M_head_impl)->_vptr_BaseCommand[3])
                           (_Var7._M_head_impl,(ulong)uVar11,pPVar17->master);
        if ((byte)iVar12 == 0) {
          bVar10 = false;
        }
        puVar21 = puVar15;
      } while (((byte)iVar12 & puVar15 != puVar6) != 0);
    }
    local_170 = std::
                map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                ::operator[](&pPVar17->master->incoming_,&pPVar17->master->exchange_round_);
    pMVar5 = local_1a0->master;
    lVar16 = (long)(int)local_1a4;
    if ((pMVar5->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar16] == (void *)0x0) {
      if (bVar10) {
        load_incoming(pMVar5,(pMVar5->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar16]);
        load_outgoing(pMVar5,(pMVar5->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar16]);
      }
      else {
        if ((long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2 == (long)local_1a0->local_limit) {
          unload(pMVar5,&local_198);
        }
        uVar11 = local_1a4;
        pMVar5 = local_1a0->master;
        Collection::load(&pMVar5->blocks_,local_1a4);
        load_incoming(pMVar5,(pMVar5->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar11]);
        load_outgoing(pMVar5,(pMVar5->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar11]);
        if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_198,
                     (iterator)
                     local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_1a4);
        }
        else {
          *local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_1a4;
          local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    puVar21 = (local_1a0->master->commands_).
              super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_178 = (local_1a0->master->commands_).
                super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pPVar17 = local_1a0;
    if (puVar21 != local_178) {
      do {
        if (bVar10) {
          pvVar20 = (void *)0x0;
        }
        else {
          pvVar20 = (pPVar17->master->blocks_).elements_.
                    super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)local_1a4];
        }
        _Var7._M_head_impl =
             (puVar21->_M_t).
             super___uniq_ptr_impl<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>
             ._M_t.
             super__Tuple_impl<0UL,_diy::Master::BaseCommand_*,_std::default_delete<diy::Master::BaseCommand>_>
             .super__Head_base<0UL,_diy::Master::BaseCommand_*,_false>._M_head_impl;
        pMVar5 = pPVar17->master;
        lVar16 = (long)(int)local_1a4;
        Proxy::Proxy((Proxy *)&local_c0,pMVar5,
                     (pMVar5->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16],(IExchangeInfo *)0x0);
        pPVar17 = local_1a0;
        pvVar8 = (pMVar5->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar16];
        pLVar9 = (pMVar5->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar16];
        stack0xfffffffffffffea8 = local_b0;
        local_168 = local_c0;
        auStack_160._0_8_ = pMStack_b8;
        if (local_a0._M_parent == (_Base_ptr)0x0) {
          local_148._M_color = _S_red;
          local_148._M_parent = (_Base_ptr)0x0;
          local_148._M_left = &local_148;
          psVar14 = local_128;
          local_148._M_right = local_148._M_left;
        }
        else {
          local_148._M_color = local_a0._M_color;
          local_148._M_parent = local_a0._M_parent;
          local_148._M_left = local_a0._M_left;
          local_148._M_right = local_a0._M_right;
          (local_a0._M_parent)->_M_parent = &local_148;
          local_128[0] = local_80[0];
          local_a0._M_parent = (_Base_ptr)0x0;
          local_a0._M_left = &local_a0;
          psVar14 = local_80;
          local_a0._M_right = local_a0._M_left;
        }
        *psVar14 = 0;
        if (local_70._M_parent == (_Base_ptr)0x0) {
          local_118._M_color = _S_red;
          local_118._M_parent = (_Base_ptr)0x0;
          local_118._M_left = &local_118;
          psVar14 = &local_f8;
          local_118._M_right = local_118._M_left;
        }
        else {
          local_118._M_color = local_70._M_color;
          local_118._M_parent = local_70._M_parent;
          local_118._M_left = local_70._M_left;
          local_118._M_right = local_70._M_right;
          (local_70._M_parent)->_M_parent = &local_118;
          local_f8 = local_50;
          local_70._M_parent = (_Base_ptr)0x0;
          local_70._M_left = &local_70;
          psVar14 = &local_50;
          local_70._M_right = local_70._M_left;
        }
        *psVar14 = 0;
        local_e0 = local_38;
        local_f0 = local_48;
        pvStack_e8 = pvStack_40;
        local_d8 = pvVar8;
        local_d0 = pLVar9;
        Proxy::~Proxy((Proxy *)&local_c0);
        (*(_Var7._M_head_impl)->_vptr_BaseCommand[2])
                  (_Var7._M_head_impl,pvVar20,(Proxy *)&local_168);
        Proxy::~Proxy((Proxy *)&local_168);
        this_00 = std::
                  map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                  ::operator[](&local_170->map,&local_17c);
        concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        ::clear(this_00);
        puVar21 = puVar21 + 1;
      } while (puVar21 != local_178);
    }
    if (bVar10) {
      pMVar5 = local_1a0->master;
      lVar16 = (long)(int)local_1a4;
      if ((pMVar5->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar16] == (void *)0x0) {
        unload_incoming(pMVar5,(pMVar5->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar16]);
        unload_outgoing(pMVar5,(pMVar5->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar16]);
      }
    }
  }
  if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void    operator()()
  {
    master.log->debug("Processing with thread: {}",  this_thread::get_id());

    std::vector<int>      local;
    do
    {
      int cur = (*idx.access())++;

      if ((size_t)cur >= blocks.size())
          return;

      int i   = blocks[cur];
      int gid = master.gid(i);
      stats::Annotation::Guard g( stats::Annotation("diy.block").set(gid) );

      if (master.block(i))
      {
          if (local.size() == (size_t)local_limit)
              master.unload(local);
          local.push_back(i);
      }

      master.log->debug("Processing block: {}", gid);

      bool skip = all_skip(i);

      IncomingQueuesMap &current_incoming = master.incoming_[master.exchange_round_].map;

      if (master.block(i) == 0)             // block unloaded
      {
          if (skip)
              master.load_queues(i);        // even though we are skipping the block, the queues might be necessary
          else
          {
              if (local.size() == (size_t)local_limit)      // reached the local limit
                  master.unload(local);

              master.load(i);
              local.push_back(i);
          }
      }

      for (auto& cmd : master.commands_)
      {
          cmd->execute(skip ? 0 : master.block(i), master.proxy(i));

          // no longer need them, so get rid of them
          current_incoming[gid].clear();
      }

      if (skip && master.block(i) == 0)
          master.unload_queues(i);    // even though we are skipping the block, the queues might be necessary
    } while(true);
  }